

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  SessionHandle *data;
  SessionHandle *data_00;
  CURLcode CVar1;
  long lVar2;
  size_t insize;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  size_t size;
  char *local_48;
  long local_40;
  size_t local_38;
  
  data = conn->data;
  if (authstatus->picked != 1) {
    if (authstatus->picked == 2) {
      CVar1 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      pcVar3 = "Digest";
      goto LAB_0056ab93;
    }
    goto LAB_0056ac3e;
  }
  if (proxy) {
    if (((conn->bits).proxy_user_passwd == true) &&
       (pcVar3 = Curl_checkProxyheaders(conn,"Proxy-authorization:"), pcVar3 == (char *)0x0)) {
      local_40 = 0x2e8;
      lVar2 = 400;
      lVar4 = 0x198;
LAB_0056ac6b:
      local_38 = 0;
      local_48 = (char *)0x0;
      data_00 = conn->data;
      pcVar3 = (data_00->state).buffer;
      curl_msnprintf(pcVar3,0x4001,"%s:%s",*(undefined8 *)((conn->chunk).hexbuffer + lVar2 + -8),
                     *(undefined8 *)((conn->chunk).hexbuffer + lVar4 + -8));
      insize = strlen(pcVar3);
      CVar1 = Curl_base64_encode(data_00,pcVar3,insize,&local_48,&local_38);
      lVar2 = local_40;
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      if (local_48 == (char *)0x0) {
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -8));
      pcVar3 = "";
      if (proxy) {
        pcVar3 = "Proxy-";
      }
      pcVar3 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar3,local_48);
      *(char **)((conn->chunk).hexbuffer + lVar2 + -8) = pcVar3;
      (*Curl_cfree)(local_48);
      if (*(long *)((conn->chunk).hexbuffer + lVar2 + -8) == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      authstatus->done = true;
      pcVar3 = "Basic";
LAB_0056ab93:
      pcVar5 = "Server";
      if (proxy) {
        pcVar5 = "Proxy";
      }
      pcVar6 = "";
      if (*(char **)(conn->local_ip + (ulong)proxy * 0x20 + 0x38) != (char *)0x0) {
        pcVar6 = *(char **)(conn->local_ip + (ulong)proxy * 0x20 + 0x38);
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar5,pcVar3,pcVar6);
      authstatus->multi = (_Bool)(authstatus->done ^ 1);
      return CURLE_OK;
    }
  }
  else if (((conn->bits).user_passwd == true) &&
          (pcVar3 = Curl_checkheaders(conn,"Authorization:"), pcVar3 == (char *)0x0)) {
    local_40 = 0x300;
    lVar2 = 0x170;
    lVar4 = 0x178;
    goto LAB_0056ac6b;
  }
  authstatus->done = true;
LAB_0056ac3e:
  authstatus->multi = false;
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if defined(USE_SPNEGO) || !defined(CURL_DISABLE_VERBOSE_STRINGS)
  struct SessionHandle *data = conn->data;
#endif
#ifdef USE_SPNEGO
  struct negotiatedata *negdata = proxy?
    &data->state.proxyneg:&data->state.negotiate;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  negdata->state = GSS_AUTHNONE;
  if((authstatus->picked == CURLAUTH_NEGOTIATE) &&
     negdata->context && !GSS_ERROR(negdata->status)) {
    auth="Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
    authstatus->done = TRUE;
    negdata->state = GSS_AUTHSENT;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth="NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth="NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth="Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization:")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth="Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }
    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy?"Proxy":"Server", auth,
          proxy?(conn->proxyuser?conn->proxyuser:""):
                (conn->user?conn->user:""));
    authstatus->multi = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multi = FALSE;

  return CURLE_OK;
}